

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O3

void __thiscall
boost::ext::ut::v1_1_8::
runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16>::runner
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this)

{
  undefined1 auVar1 [64];
  
  *(undefined8 *)&(this->reporter_).printer_.field_0x178 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x180 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x188 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x190 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x198 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x1a0 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x1a8 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x1b0 = 0;
  (this->reporter_).tests_.pass = 0;
  (this->reporter_).tests_.fail = 0;
  (this->reporter_).tests_.skip = 0;
  (this->reporter_).asserts_.pass = 0;
  (this->reporter_).asserts_.fail = 0;
  (this->reporter_).fails_ = 0;
  (this->reporter_).printer_.colors_.none._M_len = 0;
  (this->reporter_).printer_.colors_.none._M_str = (char *)0x0;
  (this->reporter_).printer_.colors_.pass._M_len = 0;
  (this->reporter_).printer_.colors_.pass._M_str = (char *)0x0;
  (this->reporter_).printer_.colors_.fail._M_len = 0;
  (this->reporter_).printer_.colors_.fail._M_str = (char *)0x0;
  *(undefined8 *)&(this->reporter_).printer_.out_ = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x38 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x40 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x48 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x150 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x158 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x160 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x168 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x170 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x178 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x180 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x188 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x110 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x118 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x120 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x128 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x130 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x138 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x140 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x148 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0xd0 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0xd8 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0xe0 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0xe8 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0xf0 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0xf8 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x100 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x108 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x90 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x98 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0xa0 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0xa8 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0xb0 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0xb8 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0xc0 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0xc8 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x50 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x58 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x60 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x68 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x70 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x78 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x80 = 0;
  *(undefined8 *)&(this->reporter_).printer_.field_0x88 = 0;
  (this->reporter_).printer_.colors_.none._M_len = 4;
  (this->reporter_).printer_.colors_.none._M_str = "\x1b[0m";
  (this->reporter_).printer_.colors_.pass._M_len = 5;
  (this->reporter_).printer_.colors_.pass._M_str = "\x1b[32m";
  (this->reporter_).printer_.colors_.fail._M_len = 5;
  (this->reporter_).printer_.colors_.fail._M_str = "\x1b[31m";
  std::__cxx11::stringstream::stringstream((stringstream *)&(this->reporter_).printer_.out_);
  this->run_ = false;
  (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->level_ = 0;
  auVar1 = ZEXT464(0) << 0x40;
  (this->path_)._M_elems[0xf]._M_str = (char *)0x0;
  this->fails_ = auVar1._0_8_;
  (this->path_)._M_elems[0]._M_len = SUB168(auVar1._8_16_,0);
  (this->path_)._M_elems[0]._M_str = (char *)SUB168(auVar1._8_16_,8);
  (this->path_)._M_elems[1]._M_len = SUB168(auVar1._24_16_,0);
  (this->path_)._M_elems[1]._M_str = (char *)SUB168(auVar1._24_16_,8);
  (this->path_)._M_elems[2]._M_len = SUB168(auVar1._40_16_,0);
  (this->path_)._M_elems[2]._M_str = (char *)SUB168(auVar1._40_16_,8);
  (this->path_)._M_elems[3]._M_len = auVar1._56_8_;
  *(undefined1 (*) [64])&(this->path_)._M_elems[3]._M_str = auVar1;
  *(undefined1 (*) [64])&(this->path_)._M_elems[7]._M_str = auVar1;
  *(undefined1 (*) [64])&(this->path_)._M_elems[0xb]._M_str = auVar1;
  filter::filter(&this->filter_,(string_view)ZEXT816(0));
  *(undefined8 *)
   ((long)&(this->tag_).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->tag_).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->tag_).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tag_).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

constexpr runner() = default;